

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GPrim *gprim,uint32_t indent,
          bool closing_brace)

{
  ostream *poVar1;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  GPrim *pGStack_18;
  uint32_t indent_local;
  GPrim *gprim_local;
  
  local_1c = (uint)gprim;
  local_1d = (byte)indent & 1;
  pGStack_18 = (GPrim *)this;
  gprim_local = (GPrim *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar1 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)pGStack_18->spec,s);
  poVar1 = ::std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = ::std::operator<<(poVar1," GPrim \"");
  poVar1 = ::std::operator<<(poVar1,(string *)&pGStack_18->name);
  ::std::operator<<(poVar1,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
  poVar1 = ::std::operator<<(aoStack_198,(string *)&local_208);
  ::std::operator<<(poVar1,"(\n");
  ::std::__cxx11::string::~string((string *)&local_208);
  pprint::Indent_abi_cxx11_(&local_228,(pprint *)(ulong)local_1c,n_01);
  poVar1 = ::std::operator<<(aoStack_198,(string *)&local_228);
  ::std::operator<<(poVar1,")\n");
  ::std::__cxx11::string::~string((string *)&local_228);
  pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_02);
  poVar1 = ::std::operator<<(aoStack_198,(string *)&local_248);
  ::std::operator<<(poVar1,"{\n");
  ::std::__cxx11::string::~string((string *)&local_248);
  print_gprim_predefined<tinyusdz::GPrim>(&local_268,pGStack_18,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::__cxx11::string::~string((string *)&local_268);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_288,(pprint *)(ulong)local_1c,n_03);
    poVar1 = ::std::operator<<(aoStack_198,(string *)&local_288);
    ::std::operator<<(poVar1,"}\n");
    ::std::__cxx11::string::~string((string *)&local_288);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GPrim &gprim, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(gprim.spec) << " GPrim \""
     << gprim.name << "\"\n";
  ss << pprint::Indent(indent) << "(\n";
  // args
  ss << pprint::Indent(indent) << ")\n";
  ss << pprint::Indent(indent) << "{\n";

  ss << print_gprim_predefined(gprim, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}